

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O0

string * read_line(string *__return_storage_ptr__,string *file)

{
  bool bVar1;
  char *pcVar2;
  long local_220;
  ifstream ifs;
  string *file_local;
  string *line;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_220,pcVar2,_S_in);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if (bVar1) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_220,(string *)__return_storage_ptr__);
  }
  std::ifstream::~ifstream(&local_220);
  return __return_storage_ptr__;
}

Assistant:

string
read_line(const string& file)
{
    ifstream ifs(file.c_str(), ifstream::in);

    string line;

    if(ifs)
    {
        getline(ifs, line);
    }

    return line;
}